

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O1

bool __thiscall VBW::ConvexCell::cell_has_conflict(ConvexCell *this,vec4 *P)

{
  uint uVar1;
  bool bVar2;
  TriangleWithFlags T;
  ulong uVar3;
  bool bVar4;
  
  uVar1 = this->first_valid_;
  uVar3 = (ulong)uVar1;
  bVar4 = (uVar1 & 0xffff) != 0x3fff;
  if (bVar4) {
    T = (this->t_).
        super_vector<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
        .
        super__Vector_base<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar1 & 0xffff];
    while (bVar2 = triangle_is_in_conflict(this,T,P), !bVar2) {
      uVar3 = (ulong)(this->t_).
                     super_vector<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
                     .
                     super__Vector_base<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar3 & 0xffff].flags;
      bVar4 = uVar3 != 0x3fff;
      if (uVar3 == 0x3fff) {
        return bVar4;
      }
      T = (this->t_).
          super_vector<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
          .
          super__Vector_base<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar3];
    }
  }
  return bVar4;
}

Assistant:

bool cell_has_conflict(const vec4& P) {
	for(
	    ushort t = first_triangle();
	    t!=END_OF_LIST; t=next_triangle(t)
	) {
	    TriangleWithFlags T = get_triangle_and_flags(t);
	    if(triangle_is_in_conflict(T,P)) {
		return true;
	    }
	}
	return false;
    }